

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O2

void dumpPointerGraph(DGLLVMPointerAnalysis *pta,PTType type)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  uint uVar3;
  PointerGraph *pPVar4;
  _Base_ptr p_Var5;
  undefined8 *puVar6;
  long lVar7;
  pointer puVar8;
  PSNode *pPVar9;
  type tVar10;
  _Base_ptr p_Var11;
  size_t sVar12;
  raw_ostream *prVar13;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  pointer puVar16;
  pointer ppFVar17;
  pointer ppPVar18;
  char *Str;
  _Base_ptr p_Var19;
  PSNode **node;
  undefined8 *puVar20;
  pointer ppPVar21;
  StringRef SVar22;
  Pointer PVar23;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> func_nodes;
  PSNode *nd;
  iterator __end2;
  set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_> nodes;
  _Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_90;
  PSNode *local_78;
  pointer local_70;
  PSNode *local_68;
  undefined1 local_60 [32];
  _Rb_tree_node_base *local_40;
  size_t local_38;
  
  tVar10 = dg::Offset::UNKNOWN;
  if (todot[0x80] != '\x01') {
    puVar8 = (pta->PS->nodes).
             super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (pta->PS->nodes).
                   super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar8;
        puVar16 = puVar16 + 1) {
      pPVar9 = (puVar16->_M_t).
               super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
               super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
               super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl;
      if (pPVar9 != (PSNode *)0x0) {
        printf("NODE %3u: ");
        printName(pPVar9,false);
        if (*(int *)(pPVar9 + 0x90) == 1) {
          if (((*(long *)(pPVar9 + 0x88) != 0) || (((byte)pPVar9[0xe9] & 1) != 0)) ||
             (pPVar9[0xe8] == (PSNode)0x1)) {
            printf(" [size: %zu, heap: %u, zeroed: %u]",*(long *)(pPVar9 + 0x88),
                   (ulong)(byte)pPVar9[0xe9],(ulong)(byte)pPVar9[0xe8]);
          }
        }
        sVar12 = dg::ADT::
                 SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                 ::size((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                         *)(pPVar9 + 0xb0));
        printf(" (points-to size: %zu)\n",sVar12);
        dg::ADT::
        SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
        ::begin((const_iterator *)local_60,
                (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                 *)(pPVar9 + 0xb0));
        while ((local_60._16_8_ != 0 || ((pointer)local_60._0_8_ != (pointer)0x0))) {
          PVar23 = dg::pta::PointerIdPointsToSet::const_iterator::operator*
                             ((const_iterator *)local_60);
          printf("    -> ");
          printName(PVar23.target,false);
          if (PVar23.offset.offset.offset == tVar10) {
            puts(" + Offset::UNKNOWN");
          }
          else {
            printf(" + %lu\n");
          }
          dg::ADT::
          SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
          ::const_iterator::operator++((const_iterator *)local_60);
        }
        if (verbose[0x80] != '\0') {
          dumpPointerGraphData(pPVar9,type,false);
        }
      }
    }
    return;
  }
  puts("digraph \"Pointer State Subgraph\" {");
  if (callgraph[0x80] == '\x01') {
    pPVar4 = pta->PS;
    p_Var11 = (pPVar4->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(pPVar4->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header;
    while ((_Rb_tree_header *)p_Var11 != p_Var1) {
      uVar3 = *(uint *)&p_Var11[1]._M_parent;
      SVar22 = (StringRef)llvm::Value::getName();
      local_90._M_impl.super__Vector_impl_data._0_16_ = SVar22;
      llvm::StringRef::str_abi_cxx11_((string *)local_60,(StringRef *)&local_90);
      printf("NODEcg%u [label=\"%s\"]\n",(ulong)uVar3,local_60._0_8_);
      std::__cxx11::string::_M_dispose();
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    }
    p_Var11 = (pPVar4->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var11 != p_Var1) {
      p_Var5 = p_Var11[1]._M_right;
      for (p_Var19 = p_Var11[1]._M_left; p_Var19 != p_Var5; p_Var19 = (_Base_ptr)&p_Var19->_M_parent
          ) {
        printf("NODEcg%u -> NODEcg%u\n",(ulong)*(uint *)&p_Var11[1]._M_parent,
               (ulong)**(uint **)p_Var19);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    }
    if (callgraph_only[0x80] != '\0') goto LAB_0011d1ae;
  }
  local_70 = display_only_func.
             super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (display_only_func.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      display_only_func.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pPVar4 = pta->PS;
    ppPVar18 = (pPVar4->_globals).
               super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    for (ppPVar21 = (pPVar4->_globals).
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppPVar21 != ppPVar18;
        ppPVar21 = ppPVar21 + 1) {
      if (*ppPVar21 != (PSNode *)0x0) {
        dumpNodeToDot(*ppPVar21,type);
      }
    }
    ppPVar18 = (pPVar4->_globals).
               super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    for (ppPVar21 = (pPVar4->_globals).
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppPVar21 != ppPVar18;
        ppPVar21 = ppPVar21 + 1) {
      if (*ppPVar21 != (PSNode *)0x0) {
        dumpNodeEdgesToDot(*ppPVar21);
      }
    }
    pPVar4 = pta->PS;
    puVar8 = (pPVar4->nodes).
             super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (pPVar4->nodes).
                   super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar8;
        puVar16 = puVar16 + 1) {
      pPVar9 = (puVar16->_M_t).
               super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
               super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
               super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl;
      if (pPVar9 != (PSNode *)0x0) {
        dumpNodeToDot(pPVar9,type);
      }
    }
    puVar8 = (pPVar4->nodes).
             super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (pPVar4->nodes).
                   super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar8;
        puVar16 = puVar16 + 1) {
      pPVar9 = (puVar16->_M_t).
               super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
               super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
               super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl;
      if (pPVar9 != (PSNode *)0x0) {
        dumpNodeEdgesToDot(pPVar9);
      }
    }
  }
  else {
    local_60._24_8_ = local_60 + 8;
    local_60._8_4_ = _S_red;
    local_60._16_8_ = 0;
    local_38 = 0;
    local_40 = (_Rb_tree_node_base *)local_60._24_8_;
    for (ppFVar17 = display_only_func.
                    super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppFVar17 != local_70;
        ppFVar17 = ppFVar17 + 1) {
      dg::DGLLVMPointerAnalysis::getFunctionNodes
                ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_90,pta,
                 *ppFVar17);
      ppPVar18 = local_90._M_impl.super__Vector_impl_data._M_finish;
      ppPVar21 = local_90._M_impl.super__Vector_impl_data._M_start;
      prVar13 = (raw_ostream *)llvm::errs();
      if (ppPVar21 == ppPVar18) {
        Str = "ERROR: Did not find any nodes for function ";
      }
      else {
        prVar13 = llvm::raw_ostream::operator<<(prVar13,"Found ");
        prVar13 = (raw_ostream *)
                  llvm::raw_ostream::operator<<
                            (prVar13,(long)local_90._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_90._M_impl.super__Vector_impl_data._M_start >> 3);
        Str = " nodes for function ";
      }
      prVar13 = llvm::raw_ostream::operator<<(prVar13,Str);
      prVar13 = llvm::raw_ostream::operator<<(prVar13,(string *)(display_only_abi_cxx11_ + 0x80));
      llvm::raw_ostream::operator<<(prVar13,"\n");
      ppPVar21 = local_90._M_impl.super__Vector_impl_data._M_finish;
      for (ppPVar18 = local_90._M_impl.super__Vector_impl_data._M_start; ppPVar18 != ppPVar21;
          ppPVar18 = ppPVar18 + 1) {
        local_78 = *ppPVar18;
        std::
        _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
        ::_M_insert_unique<dg::pta::PSNode*const&>
                  ((_Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
                    *)local_60,&local_78);
        puVar6 = *(undefined8 **)(local_78 + 0x60);
        for (puVar20 = *(undefined8 **)(local_78 + 0x58); puVar20 != puVar6; puVar20 = puVar20 + 1)
        {
          local_68 = (PSNode *)*puVar20;
          std::
          _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
          ::_M_insert_unique<dg::pta::PSNode*const&>
                    ((_Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
                      *)local_60,&local_68);
        }
      }
      std::_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Vector_base
                (&local_90);
    }
    p_Var2 = (_Rb_tree_node_base *)(local_60 + 8);
    p_Var14 = (_Rb_tree_node_base *)local_60._24_8_;
    while (p_Var15 = (_Rb_tree_node_base *)local_60._24_8_, p_Var14 != p_Var2) {
      if (*(PSNode **)(p_Var14 + 1) != (PSNode *)0x0) {
        dumpNodeToDot(*(PSNode **)(p_Var14 + 1),type);
      }
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    }
    while (p_Var14 = (_Rb_tree_node_base *)local_60._24_8_, p_Var15 != p_Var2) {
      if (*(PSNode **)(p_Var15 + 1) != (PSNode *)0x0) {
        dumpNodeEdgesToDot(*(PSNode **)(p_Var15 + 1));
      }
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    }
    while (p_Var14 != p_Var2) {
      lVar7 = *(long *)(p_Var14 + 1);
      if (((*(uint *)(lVar7 + 0x90) & 0xfffffffe) == 8) && (*(long *)(lVar7 + 0x98) != 0)) {
        printf("\tNODE%u -> NODE%u [penwidth=2 style=dashed]\n",(ulong)*(uint *)(lVar7 + 8),
               (ulong)*(uint *)(*(long *)(lVar7 + 0x98) + 8));
      }
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    }
    std::
    _Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
    ::~_Rb_tree((_Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                 *)local_60);
  }
LAB_0011d1ae:
  puts("}");
  return;
}

Assistant:

static void dumpPointerGraph(DGLLVMPointerAnalysis *pta, PTType type) {
    assert(pta);

    if (todot)
        dumpPointerGraphdot(pta, type);
    else {
        const auto &nodes = pta->getNodes();
        for (const auto &node : nodes) {
            if (node) // node id 0 is nullptr
                dumpPSNode(node.get(), type);
        }
    }
}